

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SEnumVal.cpp
# Opt level: O0

void process(char *xmlFile)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  ModelTypes MVar4;
  CreateReasons CVar5;
  ostream *poVar6;
  long *plVar7;
  SchemaGrammar *this;
  XMLCh *pXVar8;
  ContentSpecNode *pCVar9;
  DatatypeValidator *dtValidator_00;
  XMLAttDefList *attList;
  DatatypeValidator *dtValidator;
  ContentSpecNode *cSpecNode;
  ComplexTypeInfo *local_1c0;
  ComplexTypeInfo *ctype;
  XMLCh *local_1b0;
  XMLCh *fmtCntModel;
  StrX local_1a0;
  XMLCh *local_198;
  XMLCh *uriText;
  SchemaElementDecl *subsGroup;
  int mflags;
  XMLElementDecl *local_178;
  SchemaElementDecl *curElem;
  RefHash3KeysIdPoolEnumerator<xercesc_4_0::SchemaElementDecl,_xercesc_4_0::StringHasher> elemEnum;
  SchemaGrammar *grammar;
  Grammar *rootGrammar;
  SAXParser local_118 [8];
  SAXParser parser;
  char *xmlFile_local;
  
  xercesc_4_0::SAXParser::SAXParser
            (local_118,(XMLValidator *)0x0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager,
             (XMLGrammarPool *)0x0);
  xercesc_4_0::SAXParser::setValidationScheme((ValSchemes)local_118);
  xercesc_4_0::SAXParser::setDoNamespaces(SUB81(local_118,0));
  xercesc_4_0::SAXParser::setDoSchema(SUB81(local_118,0));
  xercesc_4_0::SAXParser::parse((char *)local_118);
  iVar3 = xercesc_4_0::SAXParser::getErrorCount();
  if (iVar3 == 0) {
    plVar7 = (long *)xercesc_4_0::SAXParser::getValidator();
    bVar1 = (**(code **)(*plVar7 + 0x68))();
    if ((bVar1 & 1) == 0) {
      poVar6 = std::operator<<((ostream *)&std::cout,"\n Non schema document, no output available\n"
                              );
      std::ostream::operator<<((ostream *)poVar6,std::endl<char,std::char_traits<char>>);
    }
    else {
      this = (SchemaGrammar *)xercesc_4_0::SAXParser::getRootGrammar();
      if ((this == (SchemaGrammar *)0x0) ||
         (iVar3 = (**(code **)(*(long *)this + 0x28))(), iVar3 != 1)) {
        poVar6 = std::operator<<((ostream *)&std::cout,
                                 "\n Non schema grammar, no output available\n");
        std::ostream::operator<<((ostream *)poVar6,std::endl<char,std::char_traits<char>>);
      }
      else {
        elemEnum.fMemoryManager = (MemoryManager *)this;
        xercesc_4_0::SchemaGrammar::getElemEnumerator
                  ((RefHash3KeysIdPoolEnumerator<xercesc_4_0::SchemaElementDecl,_xercesc_4_0::StringHasher>
                    *)&curElem,this);
        bVar2 = xercesc_4_0::
                RefHash3KeysIdPoolEnumerator<xercesc_4_0::SchemaElementDecl,_xercesc_4_0::StringHasher>
                ::hasMoreElements((RefHash3KeysIdPoolEnumerator<xercesc_4_0::SchemaElementDecl,_xercesc_4_0::StringHasher>
                                   *)&curElem);
        if (bVar2) {
          while (bVar2 = xercesc_4_0::
                         RefHash3KeysIdPoolEnumerator<xercesc_4_0::SchemaElementDecl,_xercesc_4_0::StringHasher>
                         ::hasMoreElements((RefHash3KeysIdPoolEnumerator<xercesc_4_0::SchemaElementDecl,_xercesc_4_0::StringHasher>
                                            *)&curElem), bVar2) {
            local_178 = (XMLElementDecl *)
                        xercesc_4_0::
                        RefHash3KeysIdPoolEnumerator<xercesc_4_0::SchemaElementDecl,_xercesc_4_0::StringHasher>
                        ::nextElement((RefHash3KeysIdPoolEnumerator<xercesc_4_0::SchemaElementDecl,_xercesc_4_0::StringHasher>
                                       *)&curElem);
            poVar6 = std::operator<<((ostream *)&std::cout,"Name:\t\t\t");
            pXVar8 = xercesc_4_0::XMLElementDecl::getFullName(local_178);
            StrX::StrX((StrX *)&stack0xfffffffffffffe80,pXVar8);
            poVar6 = operator<<(poVar6,(StrX *)&stack0xfffffffffffffe80);
            std::operator<<(poVar6,"\n");
            StrX::~StrX((StrX *)&stack0xfffffffffffffe80);
            std::operator<<((ostream *)&std::cout,"Model Type:\t\t");
            MVar4 = xercesc_4_0::SchemaElementDecl::getModelType((SchemaElementDecl *)local_178);
            switch(MVar4) {
            case Empty:
              std::operator<<((ostream *)&std::cout,"Empty");
              break;
            case Any:
              std::operator<<((ostream *)&std::cout,"Any");
              break;
            case Mixed_Simple:
              std::operator<<((ostream *)&std::cout,"Mixed_Simple");
              break;
            case Mixed_Complex:
              std::operator<<((ostream *)&std::cout,"Mixed_Complex");
              break;
            case Children:
              std::operator<<((ostream *)&std::cout,"Children");
              break;
            case Simple:
              std::operator<<((ostream *)&std::cout,"Simple");
              break;
            case ElementOnlyEmpty:
              std::operator<<((ostream *)&std::cout,"ElementOnlyEmpty");
              break;
            default:
              std::operator<<((ostream *)&std::cout,"Unknown");
            }
            std::operator<<((ostream *)&std::cout,"\n");
            std::operator<<((ostream *)&std::cout,"Create Reason:\t");
            CVar5 = xercesc_4_0::XMLElementDecl::getCreateReason(local_178);
            switch(CVar5) {
            case NoReason:
              std::operator<<((ostream *)&std::cout,"Empty");
              break;
            case Declared:
              std::operator<<((ostream *)&std::cout,"Declared");
              break;
            case AttList:
              std::operator<<((ostream *)&std::cout,"AttList");
              break;
            case InContentModel:
              std::operator<<((ostream *)&std::cout,"InContentModel");
              break;
            case AsRootElem:
              std::operator<<((ostream *)&std::cout,"AsRootElem");
              break;
            case JustFaultIn:
              std::operator<<((ostream *)&std::cout,"JustFaultIn");
              break;
            default:
              std::operator<<((ostream *)&std::cout,"Unknown");
            }
            std::operator<<((ostream *)&std::cout,"\n");
            pCVar9 = (ContentSpecNode *)(**(code **)(*(long *)local_178 + 0x40))();
            processContentSpecNode(pCVar9,false);
            subsGroup._4_4_ =
                 xercesc_4_0::SchemaElementDecl::getMiscFlags((SchemaElementDecl *)local_178);
            if (subsGroup._4_4_ != 0) {
              std::operator<<((ostream *)&std::cout,"Misc. Flags:\t");
            }
            if ((subsGroup._4_4_ & 1) != 0) {
              std::operator<<((ostream *)&std::cout,"Nillable ");
            }
            if ((subsGroup._4_4_ & 2) != 0) {
              std::operator<<((ostream *)&std::cout,"Abstract ");
            }
            if ((subsGroup._4_4_ & 4) != 0) {
              std::operator<<((ostream *)&std::cout,"Fixed ");
            }
            if (subsGroup._4_4_ != 0) {
              std::operator<<((ostream *)&std::cout,"\n");
            }
            uriText = (XMLCh *)xercesc_4_0::SchemaElementDecl::getSubstitutionGroupElem
                                         ((SchemaElementDecl *)local_178);
            if ((SchemaElementDecl *)uriText != (SchemaElementDecl *)0x0) {
              xercesc_4_0::XMLElementDecl::getURI((XMLElementDecl *)uriText);
              local_198 = (XMLCh *)xercesc_4_0::SAXParser::getURIText((uint)local_118);
              poVar6 = std::operator<<((ostream *)&std::cout,"Substitution Name:\t");
              StrX::StrX(&local_1a0,local_198);
              poVar6 = operator<<(poVar6,&local_1a0);
              poVar6 = std::operator<<(poVar6,",");
              pXVar8 = xercesc_4_0::XMLElementDecl::getBaseName((XMLElementDecl *)uriText);
              StrX::StrX((StrX *)&fmtCntModel,pXVar8);
              poVar6 = operator<<(poVar6,(StrX *)&fmtCntModel);
              std::operator<<(poVar6,"\n");
              StrX::~StrX((StrX *)&fmtCntModel);
              StrX::~StrX(&local_1a0);
            }
            local_1b0 = (XMLCh *)(**(code **)(*(long *)local_178 + 0x68))();
            if (local_1b0 != (XMLCh *)0x0) {
              poVar6 = std::operator<<((ostream *)&std::cout,"Content Model:\t");
              StrX::StrX((StrX *)&ctype,local_1b0);
              poVar6 = operator<<(poVar6,(StrX *)&ctype);
              std::operator<<(poVar6,"\n");
              StrX::~StrX((StrX *)&ctype);
            }
            local_1c0 = xercesc_4_0::SchemaElementDecl::getComplexTypeInfo
                                  ((SchemaElementDecl *)local_178);
            if (local_1c0 != (ComplexTypeInfo *)0x0) {
              std::operator<<((ostream *)&std::cout,"ComplexType:\n");
              poVar6 = std::operator<<((ostream *)&std::cout,"\tTypeName:\t");
              pXVar8 = xercesc_4_0::ComplexTypeInfo::getTypeName(local_1c0);
              StrX::StrX((StrX *)&cSpecNode,pXVar8);
              poVar6 = operator<<(poVar6,(StrX *)&cSpecNode);
              std::operator<<(poVar6,"\n");
              StrX::~StrX((StrX *)&cSpecNode);
              pCVar9 = xercesc_4_0::ComplexTypeInfo::getContentSpec(local_1c0);
              processContentSpecNode(pCVar9,true);
            }
            dtValidator_00 =
                 xercesc_4_0::SchemaElementDecl::getDatatypeValidator
                           ((SchemaElementDecl *)local_178);
            processDatatypeValidator(dtValidator_00,false);
            bVar1 = (**(code **)(*(long *)local_178 + 0x38))();
            if ((bVar1 & 1) != 0) {
              attList = (XMLAttDefList *)(**(code **)(*(long *)local_178 + 0x28))();
              processAttributes(attList,false);
            }
            std::operator<<((ostream *)&std::cout,"--------------------------------------------");
            std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
          }
        }
        else {
          poVar6 = std::operator<<((ostream *)&std::cout,
                                   "\nThe validator has no elements to display\n");
          std::ostream::operator<<((ostream *)poVar6,std::endl<char,std::char_traits<char>>);
        }
        xercesc_4_0::
        RefHash3KeysIdPoolEnumerator<xercesc_4_0::SchemaElementDecl,_xercesc_4_0::StringHasher>::
        ~RefHash3KeysIdPoolEnumerator
                  ((RefHash3KeysIdPoolEnumerator<xercesc_4_0::SchemaElementDecl,_xercesc_4_0::StringHasher>
                    *)&curElem);
      }
    }
  }
  else {
    poVar6 = std::operator<<((ostream *)&std::cout,"\nErrors occurred, no output available\n");
    std::ostream::operator<<((ostream *)poVar6,std::endl<char,std::char_traits<char>>);
  }
  xercesc_4_0::SAXParser::~SAXParser(local_118);
  return;
}

Assistant:

void process(char* const xmlFile)
{
    //
    //  Create a Schema validator to be used for our validation work. Then create
    //  a SAX parser object and pass it our validator. Then, according to what
    //  we were told on the command line, set it to validate or not. He owns
    //  the validator, so we have to allocate it.
    //
    SAXParser parser;
    parser.setValidationScheme(SAXParser::Val_Always);
    parser.setDoNamespaces(true);
    parser.setDoSchema(true);

	parser.parse(xmlFile);

    if (parser.getErrorCount())
	{
        std::cout << "\nErrors occurred, no output available\n" << std::endl;
		return;
	}

	if (!parser.getValidator().handlesSchema())
	{
		std::cout << "\n Non schema document, no output available\n" << std::endl;
		return;
	}

	Grammar* rootGrammar = parser.getRootGrammar();
	if (!rootGrammar || rootGrammar->getGrammarType() != Grammar::SchemaGrammarType)
	{
		std::cout << "\n Non schema grammar, no output available\n" << std::endl;
		return;
	}

	//
	//  Now we will get an enumerator for the element pool from the validator
	//  and enumerate the elements, printing them as we go. For each element
	//  we get an enumerator for its attributes and print them also.
	//

	SchemaGrammar* grammar = (SchemaGrammar*) rootGrammar;
	RefHash3KeysIdPoolEnumerator<SchemaElementDecl> elemEnum = grammar->getElemEnumerator();

	if (!elemEnum.hasMoreElements())
	{
		std::cout << "\nThe validator has no elements to display\n" << std::endl;
		return;
	}

	while(elemEnum.hasMoreElements())
	{
		const SchemaElementDecl& curElem = elemEnum.nextElement();

		// Name
		std::cout << "Name:\t\t\t" << StrX(curElem.getFullName()) << "\n";

		// Model Type
		std::cout << "Model Type:\t\t";
		switch( curElem.getModelType() )
		{
		case SchemaElementDecl::Empty:          std::cout << "Empty";         break;
		case SchemaElementDecl::Any:            std::cout << "Any";           break;
		case SchemaElementDecl::Mixed_Simple:   std::cout << "Mixed_Simple";  break;
		case SchemaElementDecl::Mixed_Complex:  std::cout << "Mixed_Complex"; break;
		case SchemaElementDecl::Children:       std::cout << "Children";      break;
		case SchemaElementDecl::Simple:         std::cout << "Simple";        break;
        case SchemaElementDecl::ElementOnlyEmpty:    std::cout << "ElementOnlyEmpty";    break;

		default:                                std::cout << "Unknown";       break;
		}

		std::cout << "\n";

		// Create Reason
		std::cout << "Create Reason:\t";
		switch( curElem.getCreateReason() )
		{
		case XMLElementDecl::NoReason:          std::cout << "Empty";            break;
		case XMLElementDecl::Declared:          std::cout << "Declared";         break;
		case XMLElementDecl::AttList:           std::cout << "AttList";          break;
		case XMLElementDecl::InContentModel:    std::cout << "InContentModel";   break;
		case XMLElementDecl::AsRootElem:        std::cout << "AsRootElem";       break;
		case XMLElementDecl::JustFaultIn:       std::cout << "JustFaultIn";      break;

		default:                            std::cout << "Unknown";  break;
		}

		std::cout << "\n";

		// Content Spec Node
		processContentSpecNode( curElem.getContentSpec() );

		// Misc Flags
		int mflags = curElem.getMiscFlags();
		if( mflags !=0 )
		{
			std::cout << "Misc. Flags:\t";
		}

        if ( mflags & SchemaSymbols::XSD_NILLABLE )
			std::cout << "Nillable ";

		if ( mflags & SchemaSymbols::XSD_ABSTRACT )
			std::cout << "Abstract ";

		if ( mflags & SchemaSymbols::XSD_FIXED )
			std::cout << "Fixed ";

		if( mflags !=0 )
		{
			std::cout << "\n";
		}

		// Substitution Name
		SchemaElementDecl* subsGroup = curElem.getSubstitutionGroupElem();
		if( subsGroup )
		{
			const XMLCh* uriText = parser.getURIText(subsGroup->getURI());
			std::cout << "Substitution Name:\t" << StrX(uriText)
			     << "," << StrX(subsGroup->getBaseName()) << "\n";
		}

		// Content Model
		const XMLCh* fmtCntModel = curElem.getFormattedContentModel();
		if( fmtCntModel != NULL )
		{
			std::cout << "Content Model:\t" << StrX(fmtCntModel) << "\n";
		}

		const ComplexTypeInfo* ctype = curElem.getComplexTypeInfo();
		if( ctype != NULL)
		{
			std::cout << "ComplexType:\n";
			std::cout << "\tTypeName:\t" << StrX(ctype->getTypeName()) << "\n";

			ContentSpecNode* cSpecNode = ctype->getContentSpec();
			processContentSpecNode(cSpecNode, true );
		}

		// Datatype
		DatatypeValidator* dtValidator = curElem.getDatatypeValidator();
		processDatatypeValidator( dtValidator );

		// Get an enumerator for this guy's attributes if any
		if ( curElem.hasAttDefs() )
		{
			processAttributes( curElem.getAttDefList() );
		}

		std::cout << "--------------------------------------------";
		std::cout << std::endl;

    }

    return;
}